

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O0

int lws_return_http_status(lws *wsi,uint code,char *html_body)

{
  uchar *loc;
  lws *wsi_00;
  int iVar1;
  int iVar2;
  uchar *buf;
  uchar *end_00;
  uchar *str;
  size_t sVar3;
  char *pcVar4;
  uchar local_78 [8];
  char slen [20];
  int len;
  int m;
  int n;
  char *body;
  uchar *end;
  uchar *start;
  uchar *p;
  lws_context_per_thread *pt;
  lws_context *context;
  char *html_body_local;
  lws *plStack_18;
  uint code_local;
  lws *wsi_local;
  
  context = (lws_context *)html_body;
  html_body_local._4_4_ = code;
  plStack_18 = wsi;
  pt = (lws_context_per_thread *)lws_get_context(wsi);
  wsi_00 = plStack_18;
  p = (uchar *)(((lws_context *)pt)->pt + (int)plStack_18->tsi);
  buf = ((lws_context_per_thread *)p)->serv_buf + 0x10;
  end_00 = buf + ((ulong)((lws_context *)pt)->pt_serv_buf_size - 0x10);
  str = buf + ((ulong)((lws_context *)pt)->pt_serv_buf_size - 0x200);
  slen[0x10] = '\0';
  slen[0x11] = '\0';
  slen[0x12] = '\0';
  slen[0x13] = '\0';
  start = buf;
  if (plStack_18->vhost == (lws_vhost *)0x0) {
    _lws_log(1,"%s: wsi not bound to vhost\n","lws_return_http_status");
    wsi_local._4_4_ = 1;
  }
  else {
    if ((((*(ulong *)&plStack_18->field_0x2dc >> 0x21 & 1) == 0) &&
        ((plStack_18->vhost->http).error_document_404 != (char *)0x0)) &&
       (html_body_local._4_4_ == 0x194)) {
      loc = (uchar *)(plStack_18->vhost->http).error_document_404;
      sVar3 = strlen((plStack_18->vhost->http).error_document_404);
      iVar1 = lws_http_redirect(wsi_00,0x12e,loc,(int)sVar3,&start,end_00);
      if (0 < iVar1) {
        return 0;
      }
    }
    if (context == (lws_context *)0x0) {
      context = (lws_context *)0x168322;
    }
    start = buf;
    iVar1 = lws_add_http_header_status(plStack_18,html_body_local._4_4_,&start,end_00);
    if (iVar1 == 0) {
      iVar1 = lws_add_http_header_by_token
                        (plStack_18,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)"text/html",9,&start,end_00
                        );
      if (iVar1 == 0) {
        slen._12_4_ = lws_snprintf((char *)str,0x1fe,
                                   "<html><head><meta charset=utf-8 http-equiv=\"Content-Language\" content=\"en\"/><link rel=\"stylesheet\" type=\"text/css\" href=\"/error.css\"/></head><body><h1>%u</h1>%s</body></html>"
                                   ,(ulong)html_body_local._4_4_,context);
        iVar1 = lws_snprintf((char *)local_78,0xc,"%d",(ulong)(uint)slen._12_4_);
        iVar1 = lws_add_http_header_by_token
                          (plStack_18,WSI_TOKEN_HTTP_CONTENT_LENGTH,local_78,iVar1,&start,end_00);
        if (iVar1 == 0) {
          iVar1 = lws_finalize_http_header(plStack_18,&start,end_00);
          if (iVar1 == 0) {
            iVar1 = (int)buf;
            if ((*(ulong *)&plStack_18->field_0x2dc >> 1 & 1) == 0) {
              iVar1 = ((int)start - iVar1) + slen._12_4_;
              memcpy(start,str,(long)(int)slen._12_4_);
              iVar2 = lws_write(plStack_18,buf,(long)iVar1,LWS_WRITE_HTTP);
              if (iVar2 == iVar1) {
                wsi_local._4_4_ = (uint)(iVar2 != iVar1);
              }
              else {
                wsi_local._4_4_ = 1;
              }
            }
            else {
              slen._16_4_ = lws_write(plStack_18,buf,(long)((int)start - iVar1),
                                      LWS_WRITE_HTTP_HEADERS);
              if (slen._16_4_ == (int)start - iVar1) {
                (plStack_18->http).tx_content_length = (long)(int)slen._12_4_;
                (plStack_18->http).tx_content_remain = (long)(int)slen._12_4_;
                pcVar4 = (char *)lws_realloc((void *)0x0,(long)(slen._12_4_ + 0x11),
                                             "pending status body");
                (plStack_18->h2).pending_status_body = pcVar4;
                if ((plStack_18->h2).pending_status_body == (char *)0x0) {
                  wsi_local._4_4_ = 0xffffffff;
                }
                else {
                  strcpy((plStack_18->h2).pending_status_body + 0x10,(char *)str);
                  lws_callback_on_writable(plStack_18);
                  wsi_local._4_4_ = 0;
                }
              }
              else {
                wsi_local._4_4_ = 1;
              }
            }
          }
          else {
            wsi_local._4_4_ = 1;
          }
        }
        else {
          wsi_local._4_4_ = 1;
        }
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_return_http_status(struct lws *wsi, unsigned int code,
		       const char *html_body)
{
	struct lws_context *context = lws_get_context(wsi);
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	unsigned char *p = pt->serv_buf + LWS_PRE;
	unsigned char *start = p;
	unsigned char *end = p + context->pt_serv_buf_size - LWS_PRE;
	char *body = (char *)start + context->pt_serv_buf_size - 512;
	int n = 0, m = 0, len;
	char slen[20];

	if (!wsi->vhost) {
		lwsl_err("%s: wsi not bound to vhost\n", __func__);

		return 1;
	}
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (!wsi->handling_404 &&
	    wsi->vhost->http.error_document_404 &&
	    code == HTTP_STATUS_NOT_FOUND)
		/* we should do a redirect, and do the 404 there */
		if (lws_http_redirect(wsi, HTTP_STATUS_FOUND,
			       (uint8_t *)wsi->vhost->http.error_document_404,
			       (int)strlen(wsi->vhost->http.error_document_404),
			       &p, end) > 0)
			return 0;
#endif

	/* if the redirect failed, just do a simple status */
	p = start;

	if (!html_body)
		html_body = "";

	if (lws_add_http_header_status(wsi, code, &p, end))
		return 1;

	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
					 (unsigned char *)"text/html", 9,
					 &p, end))
		return 1;

	len = lws_snprintf(body, 510, "<html><head>"
		"<meta charset=utf-8 http-equiv=\"Content-Language\" "
			"content=\"en\"/>"
		"<link rel=\"stylesheet\" type=\"text/css\" "
			"href=\"/error.css\"/>"
		"</head><body><h1>%u</h1>%s</body></html>", code, html_body);


	n = lws_snprintf(slen, 12, "%d", len);
	if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH,
					 (unsigned char *)slen, n, &p, end))
		return 1;

	if (lws_finalize_http_header(wsi, &p, end))
		return 1;

#if defined(LWS_WITH_HTTP2)
	if (wsi->mux_substream) {

		/*
		 * for HTTP/2, the headers must be sent separately, since they
		 * go out in their own frame.  That puts us in a bind that
		 * we won't always be able to get away with two lws_write()s in
		 * sequence, since the first may use up the writability due to
		 * the pipe being choked or SSL_WANT_.
		 *
		 * However we do need to send the human-readable body, and the
		 * END_STREAM.
		 *
		 * Solve it by writing the headers now...
		 */
#if defined(LWS_WITH_DETAILED_LATENCY)
		wsi->detlat.earliest_write_req_pre_write = lws_now_usecs();
#endif
		m = lws_write(wsi, start, lws_ptr_diff(p, start),
			      LWS_WRITE_HTTP_HEADERS);
		if (m != lws_ptr_diff(p, start))
			return 1;

		/*
		 * ... but stash the body and send it as a priority next
		 * handle_POLLOUT
		 */
		wsi->http.tx_content_length = len;
		wsi->http.tx_content_remain = len;

		wsi->h2.pending_status_body = lws_malloc(len + LWS_PRE + 1,
							"pending status body");
		if (!wsi->h2.pending_status_body)
			return -1;

		strcpy(wsi->h2.pending_status_body + LWS_PRE, body);
		lws_callback_on_writable(wsi);

		return 0;
	} else
#endif
	{
		/*
		 * for http/1, we can just append the body after the finalized
		 * headers and send it all in one go.
		 */

		n = lws_ptr_diff(p, start) + len;
		memcpy(p, body, len);
		m = lws_write(wsi, start, n, LWS_WRITE_HTTP);
		if (m != n)
			return 1;
	}

	return m != n;
}